

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUtilitySourceCommand.cxx
# Opt level: O0

bool __thiscall
cmUtilitySourceCommand::InitialPass
          (cmUtilitySourceCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  size_type sVar5;
  char *pcVar6;
  reference pbVar7;
  reference __rhs;
  ulong uVar8;
  bool local_3fa;
  bool local_3f9;
  allocator local_3a9;
  string local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  undefined1 local_308 [8];
  string utilityExecutable;
  allocator local_2c1;
  string local_2c0;
  allocator local_299;
  string local_298;
  string local_278 [8];
  string exePath;
  undefined1 local_250 [8];
  string utilityDirectory;
  string local_228;
  undefined1 local_208 [8];
  string cmakeCFGout;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  undefined1 local_1c0 [8];
  string file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  allocator local_149;
  undefined1 local_148 [8];
  string utilitySource;
  string *relativeSource;
  reference local_110;
  string *utilityName;
  cmState *state;
  string local_f8 [8];
  string msg;
  string local_d0;
  bool local_aa;
  allocator local_a9;
  undefined1 local_a8 [6];
  bool haveCacheValue;
  char *local_88;
  char *intDir;
  char *cacheValue;
  reference local_70;
  string *cacheEntry;
  const_iterator arg;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmUtilitySourceCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar5 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
    goto LAB_007faea7;
  }
  cacheEntry = (string *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)param_2_local);
  cacheValue = (char *)__gnu_cxx::
                       __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&cacheEntry,0);
  local_70 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&cacheValue);
  intDir = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,local_70);
  pcVar1 = (this->super_cmCommand).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_a8,"CMAKE_CFG_INTDIR",&local_a9);
  pcVar6 = cmMakefile::GetRequiredDefinition(pcVar1,(string *)local_a8);
  std::__cxx11::string::~string((string *)local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  local_aa = false;
  pcVar1 = (this->super_cmCommand).Makefile;
  local_88 = pcVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d0,"CMAKE_CROSSCOMPILING",
             (allocator *)(msg.field_2._M_local_buf + 0xf));
  bVar2 = cmMakefile::IsOn(pcVar1,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)(msg.field_2._M_local_buf + 0xf));
  if (bVar2) {
    local_aa = intDir != (char *)0x0;
    if (!local_aa) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_f8,"UTILITY_SOURCE is used in cross compiling mode for ",
                 (allocator *)((long)&state + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&state + 7));
      std::__cxx11::string::operator+=(local_f8,(string *)local_70);
      std::__cxx11::string::operator+=
                (local_f8,
                 ". If your intention is to run this executable, you need to preload the cache with the full path to a version of that program, which runs on this build machine."
                );
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmSystemTools::Message(pcVar6,"Warning");
      std::__cxx11::string::~string(local_f8);
    }
  }
  else {
    utilityName = (string *)cmMakefile::GetState((this->super_cmCommand).Makefile);
    local_3f9 = false;
    if (intDir != (char *)0x0) {
      pcVar6 = strstr(intDir,"(IntDir)");
      if (pcVar6 == (char *)0x0) {
LAB_007fa4b5:
        uVar4 = cmState::GetCacheMajorVersion((cmState *)utilityName);
        local_3fa = false;
        if (uVar4 != 0) {
          uVar4 = cmState::GetCacheMinorVersion((cmState *)utilityName);
          local_3fa = uVar4 != 0;
        }
        local_3f9 = local_3fa;
      }
      else {
        local_3f9 = false;
        if (local_88 != (char *)0x0) {
          iVar3 = strcmp(local_88,"$(IntDir)");
          local_3f9 = false;
          if (iVar3 == 0) goto LAB_007fa4b5;
        }
      }
    }
    local_aa = local_3f9;
  }
  if ((local_aa & 1U) == 0) {
    relativeSource =
         (string *)
         __gnu_cxx::
         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&cacheEntry,0);
    local_110 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&relativeSource);
    utilitySource.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&cacheEntry,0);
    pbVar7 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&utilitySource.field_2 + 8));
    pcVar6 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_148,pcVar6,&local_149);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
    std::operator+(&local_190,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                   "/");
    std::operator+(&local_170,&local_190,pbVar7);
    std::__cxx11::string::operator=((string *)local_148,(string *)&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_190);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    bVar2 = cmsys::SystemTools::FileExists(pcVar6);
    if (bVar2) {
      do {
        file.field_2._8_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local);
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&cacheEntry,
                           (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&file.field_2 + 8));
        if (!bVar2) {
          pcVar1 = (this->super_cmCommand).Makefile;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_228,"CMAKE_CFG_INTDIR",
                     (allocator *)(utilityDirectory.field_2._M_local_buf + 0xf));
          pcVar6 = cmMakefile::GetRequiredDefinition(pcVar1,&local_228);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_208,pcVar6,
                     (allocator *)(utilityDirectory.field_2._M_local_buf + 0xe));
          std::allocator<char>::~allocator
                    ((allocator<char> *)(utilityDirectory.field_2._M_local_buf + 0xe));
          std::__cxx11::string::~string((string *)&local_228);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(utilityDirectory.field_2._M_local_buf + 0xf));
          pcVar6 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_250,pcVar6,(allocator *)(exePath.field_2._M_local_buf + 0xf));
          std::allocator<char>::~allocator((allocator<char> *)(exePath.field_2._M_local_buf + 0xf));
          std::__cxx11::string::string(local_278);
          pcVar1 = (this->super_cmCommand).Makefile;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_298,"EXECUTABLE_OUTPUT_PATH",&local_299);
          pcVar6 = cmMakefile::GetDefinition(pcVar1,&local_298);
          std::__cxx11::string::~string((string *)&local_298);
          std::allocator<char>::~allocator((allocator<char> *)&local_299);
          if (pcVar6 != (char *)0x0) {
            pcVar1 = (this->super_cmCommand).Makefile;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_2c0,"EXECUTABLE_OUTPUT_PATH",&local_2c1);
            pcVar6 = cmMakefile::GetDefinition(pcVar1,&local_2c0);
            std::__cxx11::string::operator=(local_278,pcVar6);
            std::__cxx11::string::~string((string *)&local_2c0);
            std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
          }
          uVar8 = std::__cxx11::string::empty();
          if ((uVar8 & 1) == 0) {
            std::__cxx11::string::operator=((string *)local_250,local_278);
          }
          else {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&utilityExecutable.field_2 + 8),"/",pbVar7);
            std::__cxx11::string::operator+=
                      ((string *)local_250,(string *)(utilityExecutable.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)(utilityExecutable.field_2._M_local_buf + 8));
          }
          std::operator+(&local_388,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_250,"/");
          std::operator+(&local_368,&local_388,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_208);
          std::operator+(&local_348,&local_368,"/");
          std::operator+(&local_328,&local_348,local_110);
          pcVar1 = (this->super_cmCommand).Makefile;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_3a8,"CMAKE_EXECUTABLE_SUFFIX",&local_3a9);
          pcVar6 = cmMakefile::GetDefinition(pcVar1,&local_3a8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_308,&local_328,pcVar6);
          std::__cxx11::string::~string((string *)&local_3a8);
          std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
          std::__cxx11::string::~string((string *)&local_328);
          std::__cxx11::string::~string((string *)&local_348);
          std::__cxx11::string::~string((string *)&local_368);
          std::__cxx11::string::~string((string *)&local_388);
          cmsys::SystemTools::ReplaceString((string *)local_308,"/./","/");
          pbVar7 = local_70;
          pcVar1 = (this->super_cmCommand).Makefile;
          pcVar6 = (char *)std::__cxx11::string::c_str();
          cmMakefile::AddCacheDefinition
                    (pcVar1,pbVar7,pcVar6,"Path to an internal program.",FILEPATH,false);
          cmsys::SystemTools::ConvertToUnixSlashes((string *)local_308);
          pcVar1 = (this->super_cmCommand).Makefile;
          pcVar6 = (char *)std::__cxx11::string::c_str();
          cmMakefile::AddCacheDefinition
                    (pcVar1,(string *)local_308,pcVar6,"Executable to project name.",INTERNAL,false)
          ;
          this_local._7_1_ = 1;
          std::__cxx11::string::~string((string *)local_308);
          std::__cxx11::string::~string(local_278);
          std::__cxx11::string::~string((string *)local_250);
          std::__cxx11::string::~string((string *)local_208);
          break;
        }
        std::operator+(&local_1e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_148,"/");
        cmakeCFGout.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&cacheEntry,0);
        __rhs = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)((long)&cmakeCFGout.field_2 + 8));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1c0,&local_1e0,__rhs);
        std::__cxx11::string::~string((string *)&local_1e0);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        bVar2 = cmsys::SystemTools::FileExists(pcVar6);
        if (!bVar2) {
          this_local._7_1_ = 1;
        }
        std::__cxx11::string::~string((string *)local_1c0);
      } while (bVar2);
    }
    else {
      this_local._7_1_ = 1;
    }
    std::__cxx11::string::~string((string *)local_148);
  }
  else {
    this_local._7_1_ = 1;
  }
LAB_007faea7:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmUtilitySourceCommand::InitialPass(std::vector<std::string> const& args,
                                         cmExecutionStatus&)
{
  if (args.size() < 3) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  std::vector<std::string>::const_iterator arg = args.begin();

  // The first argument is the cache entry name.
  std::string const& cacheEntry = *arg++;
  const char* cacheValue = this->Makefile->GetDefinition(cacheEntry);
  // If it exists already and appears up to date then we are done.  If
  // the string contains "(IntDir)" but that is not the
  // CMAKE_CFG_INTDIR setting then the value is out of date.
  const char* intDir =
    this->Makefile->GetRequiredDefinition("CMAKE_CFG_INTDIR");

  bool haveCacheValue = false;
  if (this->Makefile->IsOn("CMAKE_CROSSCOMPILING")) {
    haveCacheValue = (cacheValue != CM_NULLPTR);
    if (!haveCacheValue) {
      std::string msg = "UTILITY_SOURCE is used in cross compiling mode for ";
      msg += cacheEntry;
      msg += ". If your intention is to run this executable, you need to "
             "preload the cache with the full path to a version of that "
             "program, which runs on this build machine.";
      cmSystemTools::Message(msg.c_str(), "Warning");
    }
  } else {
    cmState* state = this->Makefile->GetState();
    haveCacheValue =
      (cacheValue && (strstr(cacheValue, "(IntDir)") == CM_NULLPTR ||
                      (intDir && strcmp(intDir, "$(IntDir)") == 0)) &&
       (state->GetCacheMajorVersion() != 0 &&
        state->GetCacheMinorVersion() != 0));
  }

  if (haveCacheValue) {
    return true;
  }

  // The second argument is the utility's executable name, which will be
  // needed later.
  std::string const& utilityName = *arg++;

  // The third argument specifies the relative directory of the source
  // of the utility.
  std::string const& relativeSource = *arg++;
  std::string utilitySource = this->Makefile->GetCurrentSourceDirectory();
  utilitySource = utilitySource + "/" + relativeSource;

  // If the directory doesn't exist, the source has not been included.
  if (!cmSystemTools::FileExists(utilitySource.c_str())) {
    return true;
  }

  // Make sure all the files exist in the source directory.
  while (arg != args.end()) {
    std::string file = utilitySource + "/" + *arg++;
    if (!cmSystemTools::FileExists(file.c_str())) {
      return true;
    }
  }

  // The source exists.
  std::string cmakeCFGout =
    this->Makefile->GetRequiredDefinition("CMAKE_CFG_INTDIR");
  std::string utilityDirectory = this->Makefile->GetCurrentBinaryDirectory();
  std::string exePath;
  if (this->Makefile->GetDefinition("EXECUTABLE_OUTPUT_PATH")) {
    exePath = this->Makefile->GetDefinition("EXECUTABLE_OUTPUT_PATH");
  }
  if (!exePath.empty()) {
    utilityDirectory = exePath;
  } else {
    utilityDirectory += "/" + relativeSource;
  }

  // Construct the cache entry for the executable's location.
  std::string utilityExecutable = utilityDirectory + "/" + cmakeCFGout + "/" +
    utilityName + this->Makefile->GetDefinition("CMAKE_EXECUTABLE_SUFFIX");

  // make sure we remove any /./ in the name
  cmSystemTools::ReplaceString(utilityExecutable, "/./", "/");

  // Enter the value into the cache.
  this->Makefile->AddCacheDefinition(cacheEntry, utilityExecutable.c_str(),
                                     "Path to an internal program.",
                                     cmStateEnums::FILEPATH);
  // add a value into the cache that maps from the
  // full path to the name of the project
  cmSystemTools::ConvertToUnixSlashes(utilityExecutable);
  this->Makefile->AddCacheDefinition(utilityExecutable, utilityName.c_str(),
                                     "Executable to project name.",
                                     cmStateEnums::INTERNAL);

  return true;
}